

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

void anon_unknown.dwarf_16b826::readWholeFiles(int modification)

{
  float fVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  float *pfVar14;
  float *pfVar15;
  int *piVar16;
  ChannelList *this;
  ChannelList *pCVar17;
  ulong uVar18;
  ostream *poVar19;
  undefined4 uVar20;
  uint uVar21;
  undefined8 uVar22;
  long lVar23;
  int iVar24;
  _Base_ptr p_Var25;
  ulong uVar26;
  long lVar27;
  _Base_ptr p_Var28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar34;
  DeepScanLineInputPart part_1;
  Array2D<unsigned_int> sampleCount;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  FrameBuffer frameBuffer;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  MultiPartInputFile file;
  InputPart part;
  int local_204;
  undefined1 local_1f0 [16];
  _Base_ptr p_Stack_1e0;
  _Base_ptr local_1d8;
  int local_1cc;
  int *local_1c8;
  iterator iStack_1c0;
  int *local_1b8;
  _Base_ptr local_1b0;
  Array2D<Imath_3_2::half_*> local_1a8;
  Array2D<float_*> local_188;
  Array2D<unsigned_int_*> local_168;
  DeepFrameBuffer local_150;
  Array2D<Imath_3_2::half> local_e8;
  Array2D<float> local_c8;
  Array2D<unsigned_int> local_a8;
  MultiPartInputFile local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  ulong local_70;
  FrameBuffer local_68;
  
  pcVar3 = (anonymous_namespace)::filename_abi_cxx11_;
  local_a8._sizeX = 0;
  local_a8._sizeY = 0;
  local_a8._data = (uint *)0x0;
  local_c8._data = (float *)0x0;
  local_c8._sizeX = 0;
  local_c8._sizeY = 0;
  local_e8._data = (half *)0x0;
  local_e8._sizeX = 0;
  local_e8._sizeY = 0;
  local_168._data = (uint **)0x0;
  local_168._sizeX = 0;
  local_168._sizeY = 0;
  local_188._data = (float **)0x0;
  local_188._sizeX = 0;
  local_188._sizeY = 0;
  local_1a8._data = (half **)0x0;
  local_1a8._sizeX = 0;
  local_1a8._sizeY = 0;
  local_1d8 = (_Base_ptr)0x0;
  local_1f0._8_8_ = 0;
  p_Stack_1e0 = (_Base_ptr)0x0;
  iVar6 = Imf_3_4::globalThreadCount();
  uVar22 = 1;
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_90,pcVar3,iVar6,true);
  lVar27 = 0;
  while( true ) {
    uVar20 = (undefined4)uVar22;
    iVar6 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar6 <= lVar27) break;
    Imf_3_4::MultiPartInputFile::header((int)local_90);
    puVar12 = (undefined8 *)Imf_3_4::Header::displayWindow();
    puVar13 = (undefined8 *)Imf_3_4::Header::displayWindow();
    iVar6 = -(uint)((int)*puVar13 == (int)*puVar12);
    iVar33 = -(uint)((int)((ulong)*puVar13 >> 0x20) == (int)((ulong)*puVar12 >> 0x20));
    auVar29._4_4_ = iVar6;
    auVar29._0_4_ = iVar6;
    auVar29._8_4_ = iVar33;
    auVar29._12_4_ = iVar33;
    iVar6 = movmskpd(uVar20,auVar29);
    if ((iVar6 != 3) ||
       (iVar33 = -(uint)((int)puVar13[1] == (int)puVar12[1]),
       iVar34 = -(uint)((int)((ulong)puVar13[1] >> 0x20) == (int)((ulong)puVar12[1] >> 0x20)),
       auVar30._4_4_ = iVar33, auVar30._0_4_ = iVar33, auVar30._8_4_ = iVar34,
       auVar30._12_4_ = iVar34, iVar33 = movmskpd((int)puVar13,auVar30), iVar33 != 3)) {
      __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32b,"void (anonymous namespace)::readWholeFiles(int)");
    }
    puVar12 = (undefined8 *)Imf_3_4::Header::dataWindow();
    puVar13 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar33 = -(uint)((int)*puVar13 == (int)*puVar12);
    iVar34 = -(uint)((int)((ulong)*puVar13 >> 0x20) == (int)((ulong)*puVar12 >> 0x20));
    auVar31._4_4_ = iVar33;
    auVar31._0_4_ = iVar33;
    auVar31._8_4_ = iVar34;
    auVar31._12_4_ = iVar34;
    uVar21 = movmskpd(iVar6,auVar31);
    uVar18 = (ulong)uVar21;
    if ((uVar21 != 3) ||
       (iVar6 = -(uint)((int)puVar13[1] == (int)puVar12[1]),
       iVar33 = -(uint)((int)((ulong)puVar13[1] >> 0x20) == (int)((ulong)puVar12[1] >> 0x20)),
       auVar32._4_4_ = iVar6, auVar32._0_4_ = iVar6, auVar32._8_4_ = iVar33, auVar32._12_4_ = iVar33
       , iVar6 = movmskpd((int)puVar13,auVar32), iVar6 != 3)) {
      __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32c,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar14 = (float *)Imf_3_4::Header::pixelAspectRatio();
    fVar1 = *pfVar14;
    pfVar14 = (float *)Imf_3_4::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar14) || (NAN(fVar1) || NAN(*pfVar14))) {
      __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32d,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar14 = (float *)Imf_3_4::Header::screenWindowCenter();
    pfVar15 = (float *)Imf_3_4::Header::screenWindowCenter();
    if ((((*pfVar14 != *pfVar15) || (NAN(*pfVar14) || NAN(*pfVar15))) || (pfVar14[1] != pfVar15[1]))
       || (NAN(pfVar14[1]) || NAN(pfVar15[1]))) {
      __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32f,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar14 = (float *)Imf_3_4::Header::screenWindowWidth();
    fVar1 = *pfVar14;
    pfVar14 = (float *)Imf_3_4::Header::screenWindowWidth();
    if ((fVar1 != *pfVar14) || (NAN(fVar1) || NAN(*pfVar14))) {
      __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x330,"void (anonymous namespace)::readWholeFiles(int)");
    }
    piVar16 = (int *)Imf_3_4::Header::lineOrder();
    iVar6 = *piVar16;
    piVar16 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar6 != *piVar16) {
      __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x331,"void (anonymous namespace)::readWholeFiles(int)");
    }
    piVar16 = (int *)Imf_3_4::Header::compression();
    iVar6 = *piVar16;
    piVar16 = (int *)Imf_3_4::Header::compression();
    if (iVar6 != *piVar16) {
      __assert_fail("header.compression () == headers[i].compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x332,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this = (ChannelList *)Imf_3_4::Header::channels();
    pCVar17 = (ChannelList *)Imf_3_4::Header::channels();
    cVar4 = Imf_3_4::ChannelList::operator==(this,pCVar17);
    if (cVar4 == '\0') {
      __assert_fail("header.channels () == headers[i].channels ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x333,"void (anonymous namespace)::readWholeFiles(int)");
    }
    puVar12 = (undefined8 *)Imf_3_4::Header::name_abi_cxx11_();
    puVar13 = (undefined8 *)Imf_3_4::Header::name_abi_cxx11_();
    sVar2 = puVar12[1];
    if ((sVar2 != puVar13[1]) ||
       ((sVar2 != 0 && (iVar6 = bcmp((void *)*puVar12,(void *)*puVar13,sVar2), iVar6 != 0)))) {
      __assert_fail("header.name () == headers[i].name ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x334,"void (anonymous namespace)::readWholeFiles(int)");
    }
    uVar22 = CONCAT71((int7)(uVar18 >> 8),lVar27 == 0 && modification == 1);
    if (lVar27 == 0 && modification == 1) {
      puVar12 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      puVar13 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      sVar2 = puVar12[1];
      if ((sVar2 == puVar13[1]) &&
         ((sVar2 == 0 || (iVar6 = bcmp((void *)*puVar12,(void *)*puVar13,sVar2), iVar6 == 0)))) {
        __assert_fail("header.type () != headers[i].type ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                      ,0x337,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    else {
      puVar12 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      puVar13 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      sVar2 = puVar12[1];
      if ((sVar2 != puVar13[1]) ||
         ((sVar2 != 0 && (iVar6 = bcmp((void *)*puVar12,(void *)*puVar13,sVar2), iVar6 != 0)))) {
        __assert_fail("header.type () == headers[i].type ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                      ,0x339,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    lVar27 = lVar27 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading whole files ",0x14);
  std::ostream::flush();
  local_1c8 = (int *)0x0;
  iStack_1c0._M_current = (int *)0x0;
  local_1b8 = (int *)0x0;
  local_150._map._M_t._M_impl._0_4_ = ZEXT14(0 < modification);
  if ((int)((ulong)(DAT_001eb890 - (anonymous_namespace)::headers) >> 3) * -0x49249249 <=
      (int)local_150._map._M_t._M_impl._0_4_) goto LAB_001625ae;
  lVar27 = DAT_001eb890;
  lVar23 = (anonymous_namespace)::headers;
  do {
    if (iStack_1c0._M_current == local_1b8) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_1c8,iStack_1c0,(int *)&local_150);
      lVar27 = DAT_001eb890;
      lVar23 = (anonymous_namespace)::headers;
    }
    else {
      *iStack_1c0._M_current = local_150._map._M_t._M_impl._0_4_;
      iStack_1c0._M_current = iStack_1c0._M_current + 1;
    }
    local_150._map._M_t._M_impl._0_4_ = local_150._map._M_t._M_impl._0_4_ + 1;
  } while ((int)local_150._map._M_t._M_impl._0_4_ <
           (int)((ulong)(lVar27 - lVar23) >> 3) * -0x49249249);
  if ((long)iStack_1c0._M_current - (long)local_1c8 == 0) {
LAB_0016259c:
    if (local_1c8 == (int *)0x0) goto LAB_001625ae;
  }
  else {
    uVar18 = (long)iStack_1c0._M_current - (long)local_1c8 >> 2;
    uVar26 = 0;
    do {
      iVar33 = random_int((int)uVar18);
      iVar34 = random_int((int)((ulong)((long)iStack_1c0._M_current - (long)local_1c8) >> 2));
      iVar6 = local_1c8[iVar33];
      local_1c8[iVar33] = local_1c8[iVar34];
      local_1c8[iVar34] = iVar6;
      uVar26 = uVar26 + 1;
      uVar18 = (long)iStack_1c0._M_current - (long)local_1c8 >> 2;
    } while (uVar26 < uVar18);
    if (iStack_1c0._M_current != local_1c8) {
      p_Var25 = (_Base_ptr)0x0;
      uVar18 = 0;
      do {
        iVar6 = local_1c8[uVar18];
        lVar27 = (long)iVar6;
        local_70 = uVar18;
        switch(*(undefined4 *)((anonymous_namespace)::partTypes + lVar27 * 4)) {
        case 0:
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_150._map._M_t._M_impl.super__Rb_tree_header._M_header;
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          setInputFrameBuffer((FrameBuffer *)&local_150,
                              *(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4),&local_a8,
                              &local_c8,&local_e8,0x10,0x10);
          Imf_3_4::InputPart::InputPart((InputPart *)&local_68,local_90,iVar6);
          Imf_3_4::InputPart::setFrameBuffer(&local_68);
          Imf_3_4::InputPart::readPixels((int)&local_68,0);
          iVar33 = *(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4);
          if (iVar33 == 0) {
            bVar5 = checkPixels<unsigned_int>(&local_a8,0,0xf,0,0xf,0x10);
            if (!bVar5) {
              __assert_fail("checkPixels<unsigned int> ( uData, width, height)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x36a,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar33 == 1) {
            bVar5 = checkPixels<float>(&local_c8,0,0xf,0,0xf,0x10);
            if (!bVar5) {
              __assert_fail("checkPixels<float> (fData, width, height)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x36d,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar33 == 2) &&
                  (bVar5 = checkPixels<Imath_3_2::half>(&local_e8,0,0xf,0,0xf,0x10), !bVar5)) {
            __assert_fail("checkPixels<half> (hData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                          ,0x370,"void (anonymous namespace)::readWholeFiles(int)");
          }
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&local_150);
          break;
        case 1:
          Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)&local_68,local_90,iVar6);
          iVar33 = Imf_3_4::TiledInputPart::numXLevels();
          local_1b0 = p_Var25;
          iVar34 = Imf_3_4::TiledInputPart::numYLevels();
          p_Var25 = local_1b0;
          if (0 < iVar33) {
            iVar7 = 0;
            do {
              if (0 < iVar34) {
                iVar8 = 0;
                do {
                  cVar4 = Imf_3_4::TiledInputPart::isValidLevel((int)&local_68,iVar7);
                  if (cVar4 != '\0') {
                    iVar10 = Imf_3_4::TiledInputPart::levelWidth((int)&local_68);
                    iVar24 = Imf_3_4::TiledInputPart::levelHeight((int)&local_68);
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)0x0;
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_150._map._M_t._M_impl.super__Rb_tree_header._M_header;
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    setInputFrameBuffer((FrameBuffer *)&local_150,
                                        *(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4),
                                        &local_a8,&local_c8,&local_e8,iVar10,iVar24);
                    Imf_3_4::TiledInputPart::setFrameBuffer(&local_68);
                    iVar11 = (int)&local_68;
                    iVar9 = Imf_3_4::TiledInputPart::numXTiles(iVar11);
                    iVar11 = Imf_3_4::TiledInputPart::numYTiles(iVar11);
                    Imf_3_4::TiledInputPart::readTiles
                              ((int)&local_68,0,iVar9 + -1,0,iVar11 + -1,iVar7);
                    iVar9 = *(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4);
                    if (iVar9 == 0) {
                      bVar5 = checkPixels<unsigned_int>
                                        (&local_a8,0,iVar10 + -1,0,iVar24 + -1,iVar10);
                      if (!bVar5) {
                        __assert_fail("checkPixels<unsigned int> ( uData, w, h)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                      ,0x399,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                    }
                    else if (iVar9 == 1) {
                      bVar5 = checkPixels<float>(&local_c8,0,iVar10 + -1,0,iVar24 + -1,iVar10);
                      if (!bVar5) {
                        __assert_fail("checkPixels<float> (fData, w, h)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                      ,0x39c,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                    }
                    else if ((iVar9 == 2) &&
                            (bVar5 = checkPixels<Imath_3_2::half>
                                               (&local_e8,0,iVar10 + -1,0,iVar24 + -1,iVar10),
                            !bVar5)) {
                      __assert_fail("checkPixels<half> (hData, w, h)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                    ,0x39f,"void (anonymous namespace)::readWholeFiles(int)");
                    }
                    std::
                    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                                 *)&local_150);
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar34 != iVar8);
              }
              iVar7 = iVar7 + 1;
              p_Var25 = local_1b0;
            } while (iVar7 != iVar33);
          }
          break;
        case 2:
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)local_1f0,local_90,iVar6);
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_150._map._M_t._M_impl.super__Rb_tree_header._M_header;
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_4::Slice::Slice(&local_150._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
          p_Var28 = (_Base_ptr)operator_new__(0x400);
          if (p_Var25 != (_Base_ptr)0x0) {
            operator_delete__(p_Var25);
          }
          local_1f0._8_8_ = 0x10;
          p_Stack_1e0 = (_Base_ptr)0x10;
          local_1d8 = p_Var28;
          Imf_3_4::Slice::Slice((Slice *)&local_68,UINT,(char *)p_Var28,4,0x40,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_150);
          setInputDeepFrameBuffer
                    (&local_150,*(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4),&local_168,
                     &local_188,&local_1a8,0x10,0x10);
          Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)local_1f0);
          Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)local_1f0,0);
          allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4),
                         (Array2D<unsigned_int> *)(local_1f0 + 8),&local_168,&local_188,&local_1a8,0
                         ,0xf,0,0xf);
          Imf_3_4::DeepScanLineInputPart::readPixels((int)local_1f0,0);
          iVar33 = *(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4);
          if (iVar33 == 0) {
            bVar5 = checkPixels<unsigned_int>
                              ((Array2D<unsigned_int> *)(local_1f0 + 8),&local_168,0,0xf,0,0xf,0x10)
            ;
            if (!bVar5) {
              __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, width, height)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x3cc,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar33 == 1) {
            bVar5 = checkPixels<float>((Array2D<unsigned_int> *)(local_1f0 + 8),&local_188,0,0xf,0,
                                       0xf,0x10);
            if (!bVar5) {
              __assert_fail("checkPixels<float> ( sampleCount, deepFData, width, height)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x3d0,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar33 == 2) &&
                  (bVar5 = checkPixels<Imath_3_2::half>
                                     ((Array2D<unsigned_int> *)(local_1f0 + 8),&local_1a8,0,0xf,0,
                                      0xf,0x10), !bVar5)) {
            __assert_fail("checkPixels<half> ( sampleCount, deepHData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                          ,0x3d4,"void (anonymous namespace)::readWholeFiles(int)");
          }
          releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4),&local_168,
                        &local_188,&local_1a8,0,0xf,0,0xf);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                       *)&local_150);
          p_Var25 = p_Var28;
          break;
        case 3:
          Imf_3_4::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)local_1f0,local_90,iVar6);
          local_1cc = Imf_3_4::DeepTiledInputPart::numXLevels();
          iVar33 = Imf_3_4::DeepTiledInputPart::numYLevels();
          if (0 < local_1cc) {
            local_204 = 0;
            do {
              p_Var28 = p_Var25;
              if (0 < iVar33) {
                iVar34 = 0;
                do {
                  cVar4 = Imf_3_4::DeepTiledInputPart::isValidLevel((int)local_1f0,local_204);
                  if (cVar4 != '\0') {
                    iVar7 = Imf_3_4::DeepTiledInputPart::levelWidth((int)local_1f0);
                    iVar8 = Imf_3_4::DeepTiledInputPart::levelHeight((int)local_1f0);
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)0x0;
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_150._map._M_t._M_impl.super__Rb_tree_header._M_header;
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                    local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_150._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    Imf_3_4::Slice::Slice
                              (&local_150._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
                    p_Var28 = (_Base_ptr)(long)iVar7;
                    uVar18 = (long)iVar8 * (long)p_Var28;
                    local_1b0 = (_Base_ptr)
                                operator_new__(-(ulong)(uVar18 >> 0x3e != 0) | uVar18 * 4);
                    if (p_Var25 != (_Base_ptr)0x0) {
                      operator_delete__(p_Var25);
                    }
                    local_1d8 = local_1b0;
                    local_1f0._8_8_ = (long)iVar8;
                    p_Stack_1e0 = p_Var28;
                    Imf_3_4::Slice::Slice
                              ((Slice *)&local_68,UINT,(char *)local_1b0,4,(long)p_Var28 << 2,1,1,
                               0.0,false,false);
                    Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_150);
                    setInputDeepFrameBuffer
                              (&local_150,*(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4),
                               &local_168,&local_188,&local_1a8,iVar7,iVar8);
                    Imf_3_4::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)local_1f0);
                    iVar9 = Imf_3_4::DeepTiledInputPart::numXTiles((int)local_1f0);
                    iVar10 = Imf_3_4::DeepTiledInputPart::numYTiles((int)local_1f0);
                    Imf_3_4::DeepTiledInputPart::readPixelSampleCounts
                              ((int)local_1f0,0,iVar9 + -1,0,iVar10 + -1,local_204);
                    iVar24 = iVar7 + -1;
                    iVar8 = iVar8 + -1;
                    allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4),
                                   (Array2D<unsigned_int> *)(local_1f0 + 8),&local_168,&local_188,
                                   &local_1a8,0,iVar24,0,iVar8);
                    Imf_3_4::DeepTiledInputPart::readTiles
                              ((int)local_1f0,0,iVar9 + -1,0,iVar10 + -1,local_204);
                    iVar9 = *(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4);
                    if (iVar9 == 0) {
                      bVar5 = checkPixels<unsigned_int>
                                        ((Array2D<unsigned_int> *)(local_1f0 + 8),&local_168,0,
                                         iVar24,0,iVar8,iVar7);
                      if (!bVar5) {
                        __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, w, h)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                      ,0x421,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                    }
                    else if (iVar9 == 1) {
                      bVar5 = checkPixels<float>((Array2D<unsigned_int> *)(local_1f0 + 8),&local_188
                                                 ,0,iVar24,0,iVar8,iVar7);
                      if (!bVar5) {
                        __assert_fail("checkPixels<float> ( sampleCount, deepFData, w, h)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                      ,0x425,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                    }
                    else if ((iVar9 == 2) &&
                            (bVar5 = checkPixels<Imath_3_2::half>
                                               ((Array2D<unsigned_int> *)(local_1f0 + 8),&local_1a8,
                                                0,iVar24,0,iVar8,iVar7), !bVar5)) {
                      __assert_fail("checkPixels<half> ( sampleCount, deepHData, w, h)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                    ,0x429,"void (anonymous namespace)::readWholeFiles(int)");
                    }
                    releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar27 * 4),
                                  &local_168,&local_188,&local_1a8,0,iVar24,0,iVar8);
                    std::
                    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                                 *)&local_150);
                    p_Var25 = local_1b0;
                    p_Var28 = local_1b0;
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar33 != iVar34);
              }
              local_204 = local_204 + 1;
              p_Var25 = p_Var28;
            } while (local_204 != local_1cc);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"part ",5);
        poVar19 = (ostream *)std::ostream::operator<<(&std::cerr,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," ok ",4);
        uVar18 = local_70 + 1;
      } while (uVar18 < (ulong)((long)iStack_1c0._M_current - (long)local_1c8 >> 2));
      goto LAB_0016259c;
    }
  }
  operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
LAB_001625ae:
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_1d8 != (_Base_ptr)0x0) {
    operator_delete__(local_1d8);
  }
  if (local_1a8._data != (half **)0x0) {
    operator_delete__(local_1a8._data);
  }
  if (local_188._data != (float **)0x0) {
    operator_delete__(local_188._data);
  }
  if (local_168._data != (uint **)0x0) {
    operator_delete__(local_168._data);
  }
  if (local_e8._data != (half *)0x0) {
    operator_delete__(local_e8._data);
  }
  if (local_c8._data != (float *)0x0) {
    operator_delete__(local_c8._data);
  }
  if (local_a8._data != (uint *)0x0) {
    operator_delete__(local_a8._data);
  }
  return;
}

Assistant:

void
readWholeFiles (int modification)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file (filename.c_str ());
    for (int i = 0; i < file.parts (); i++)
    {
        const Header& header = file.header (i);
        assert (header.displayWindow () == headers[i].displayWindow ());
        assert (header.dataWindow () == headers[i].dataWindow ());
        assert (header.pixelAspectRatio () == headers[i].pixelAspectRatio ());
        assert (
            header.screenWindowCenter () == headers[i].screenWindowCenter ());
        assert (header.screenWindowWidth () == headers[i].screenWindowWidth ());
        assert (header.lineOrder () == headers[i].lineOrder ());
        assert (header.compression () == headers[i].compression ());
        assert (header.channels () == headers[i].channels ());
        assert (header.name () == headers[i].name ());
        if (modification == 1 && i == 0)
        {
            assert (header.type () != headers[i].type ());
        }
        else { assert (header.type () == headers[i].type ()); }
    }

    cout << "Reading whole files " << flush;

    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    for (int i = modification > 0 ? 1 : 0;
         i < static_cast<int> (headers.size ());
         i++)
        shuffledPartNumber.push_back (i);
    for (size_t i = 0; i < shuffledPartNumber.size (); i++)
    {
        size_t a = random_int (shuffledPartNumber.size ());
        size_t b = random_int (shuffledPartNumber.size ());
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }

    //
    // Start reading whole files.
    //
    int partNumber;
    try
    {
        for (size_t i = 0; i < shuffledPartNumber.size (); i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0: {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        uData,
                        fData,
                        hData,
                        width,
                        height);

                    InputPart part (file, partNumber);
                    part.setFrameBuffer (frameBuffer);
                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                uData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (fData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (hData, width, height));
                            break;
                    }
                    break;
                }
                case 1: {
                    TiledInputPart part (file, partNumber);
                    int            numXLevels = part.numXLevels ();
                    int            numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                uData,
                                fData,
                                hData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);
                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);
                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        uData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (fData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2: {
                    DeepScanLineInputPart part (file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase (height, width);
                    frameBuffer.insertSampleCountSlice (Slice (
                        IMF::UINT,
                        (char*) (&sampleCount[0][0]),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.setFrameBuffer (frameBuffer);

                    part.readPixelSampleCounts (0, height - 1);

                    allocatePixels (
                        pixelTypes[partNumber],
                        sampleCount,
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (
                                sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (
                                sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels (
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    break;
                }
                case 3: {
                    DeepTiledInputPart part (file, partNumber);
                    int                numXLevels = part.numXLevels ();
                    int                numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase (h, w);
                            frameBuffer.insertSampleCountSlice (Slice (
                                IMF::UINT,
                                (char*) (&sampleCount[0][0]),
                                sizeof (unsigned int) * 1,
                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);

                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);

                            part.readPixelSampleCounts (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);

                            allocatePixels (
                                pixelTypes[partNumber],
                                sampleCount,
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (
                                        sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (
                                        sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels (
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);
                        }

                    break;
                }
            }
            cerr << "part " << partNumber << " ok ";
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}